

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrNtbdd.c
# Opt level: O0

int Aig_ManSizeOfGlobalBdds(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pObj_00;
  DdNode *Entry;
  DdNode **nodeArray;
  int local_28;
  int i;
  int RetValue;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vFuncsGlob;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManCoNum(p);
  p_00 = Vec_PtrAlloc(iVar1);
  for (local_28 = 0; iVar1 = Vec_PtrSize(p->vCos), local_28 < iVar1; local_28 = local_28 + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_28);
    Entry = Aig_ObjGlobalBdd(pObj_00);
    Vec_PtrPush(p_00,Entry);
  }
  nodeArray = (DdNode **)Vec_PtrArray(p_00);
  iVar1 = Vec_PtrSize(p_00);
  iVar1 = Cudd_SharingSize(nodeArray,iVar1);
  Vec_PtrFree(p_00);
  return iVar1;
}

Assistant:

int Aig_ManSizeOfGlobalBdds( Aig_Man_t * p ) 
{
    Vec_Ptr_t * vFuncsGlob;
    Aig_Obj_t * pObj;
    int RetValue, i;
    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Aig_ManCoNum(p) );
    Aig_ManForEachCo( p, pObj, i )
        Vec_PtrPush( vFuncsGlob, Aig_ObjGlobalBdd(pObj) );
    RetValue = Cudd_SharingSize( (DdNode **)Vec_PtrArray(vFuncsGlob), Vec_PtrSize(vFuncsGlob) );
    Vec_PtrFree( vFuncsGlob );
    return RetValue;
}